

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  byte bVar1;
  U32 UVar2;
  int iVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  long lVar10;
  uint uVar11;
  BYTE *pInLoopLimit;
  size_t sVar12;
  byte bVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong *puVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  U32 UVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ulong *puVar28;
  BYTE *pStart;
  long local_80;
  
  uVar17 = (ms->cParams).minMatch;
  if (1 < uVar17 - 6) {
    if (uVar17 != 5) {
      bVar1 = (byte)(ms->cParams).chainLog;
      uVar21 = 1 << (bVar1 & 0x1f);
      pUVar4 = ms->chainTable;
      pBVar5 = (ms->window).base;
      uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar2 = (ms->window).lowLimit;
      uVar16 = (uint)((long)ip - (long)pBVar5);
      UVar22 = uVar16 - uVar17;
      if (uVar16 - UVar2 <= uVar17) {
        UVar22 = UVar2;
      }
      uVar17 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        UVar22 = UVar2;
      }
      uVar26 = uVar16 - uVar21;
      if (uVar16 < uVar21) {
        uVar26 = 0;
      }
      iVar15 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pZVar6 = ms->dictMatchState;
      pUVar7 = ms->hashTable;
      uVar14 = (ulong)ms->nextToUpdate;
      bVar13 = 0x20 - (char)(ms->cParams).hashLog;
      if (ms->nextToUpdate < uVar16) {
        do {
          uVar25 = (uint)(*(int *)(pBVar5 + uVar14) * -0x61c8864f) >> (bVar13 & 0x1f);
          pUVar4[(uint)uVar14 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar25];
          pUVar7[uVar25] = (uint)uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar14 < ((long)ip - (long)pBVar5 & 0xffffffffU));
      }
      ms->nextToUpdate = uVar16;
      iVar3 = *(int *)ip;
      uVar11 = iVar3 * -0x61c8864f;
      uVar25 = pUVar7[uVar11 >> (bVar13 & 0x1f)];
      uVar14 = 3;
      if (uVar25 < UVar22) {
LAB_002059f0:
        uVar25 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
        pBVar8 = (pZVar6->window).nextSrc;
        pBVar9 = (pZVar6->window).base;
        uVar21 = (int)pBVar8 - (int)pBVar9;
        uVar26 = uVar21 - uVar25;
        if (uVar21 < uVar25) {
          uVar26 = 0;
        }
        if (iVar15 == 0) {
          return uVar14;
        }
        uVar23 = (pZVar6->window).dictLimit;
        uVar11 = pZVar6->hashTable[uVar11 >> (-(char)(pZVar6->cParams).hashLog & 0x1fU)];
        if (uVar11 < uVar23) {
          return uVar14;
        }
        pUVar4 = pZVar6->chainTable;
        while( true ) {
          iVar15 = iVar15 + -1;
          if (*(int *)(pBVar9 + uVar11) == iVar3) {
            sVar12 = ZSTD_count_2segments
                               (ip + 4,pBVar9 + (ulong)uVar11 + 4,iLimit,pBVar8,pBVar5 + uVar17);
            uVar20 = sVar12 + 4;
            if ((uVar14 < uVar20) &&
               (*offsetPtr = (ulong)(((uVar16 - uVar17) + uVar21 + 2) - uVar11), uVar14 = uVar20,
               ip + uVar20 == iLimit)) {
              return uVar20;
            }
          }
          if (uVar11 <= uVar26) {
            return uVar14;
          }
          if (iVar15 == 0) break;
          uVar11 = pUVar4[uVar11 & uVar25 - 1];
          if (uVar11 < uVar23) {
            return uVar14;
          }
        }
        return uVar14;
      }
      uVar20 = uVar14;
      do {
        puVar18 = (ulong *)(pBVar5 + uVar25);
        if (*(BYTE *)(uVar20 + (long)puVar18) == ip[uVar20]) {
          puVar28 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar18 == *(ulong *)ip) {
              lVar19 = (ulong)uVar25 + 8;
              lVar24 = 0;
              do {
                puVar28 = (ulong *)(ip + lVar24 + 8);
                if (iLimit + -7 <= puVar28) {
                  puVar18 = (ulong *)(pBVar5 + lVar24 + lVar19);
                  goto LAB_00205d32;
                }
                lVar10 = lVar24 + lVar19;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar5 + lVar10) == *puVar28);
              uVar27 = *puVar28 ^ *(ulong *)(pBVar5 + lVar10);
              uVar14 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar27 = *(ulong *)ip ^ *puVar18;
              uVar14 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00205d32:
            if ((puVar28 < iLimit + -3) && ((int)*puVar18 == (int)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar18 = (ulong *)((long)puVar18 + 4);
            }
            if ((puVar28 < iLimit + -1) && ((short)*puVar18 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar18 = (ulong *)((long)puVar18 + 2);
            }
            if (puVar28 < iLimit) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar18 == (char)*puVar28));
            }
            uVar14 = (long)puVar28 - (long)ip;
          }
          if ((uVar20 < uVar14) &&
             (*offsetPtr = (ulong)((uVar16 + 2) - uVar25), uVar20 = uVar14, ip + uVar14 == iLimit))
          goto LAB_002059f0;
        }
        uVar14 = uVar20;
        if ((uVar25 <= uVar26) ||
           ((iVar15 = iVar15 + -1, iVar15 == 0 ||
            (uVar25 = pUVar4[uVar25 & uVar21 - 1], uVar20 = uVar14, uVar25 < UVar22))))
        goto LAB_002059f0;
      } while( true );
    }
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar26 = 1 << (bVar1 & 0x1f);
    pUVar4 = ms->chainTable;
    pBVar5 = (ms->window).base;
    uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar17 = (ms->window).lowLimit;
    uVar25 = (uint)((long)ip - (long)pBVar5);
    uVar21 = uVar25 - uVar16;
    if (uVar25 - uVar17 <= uVar16) {
      uVar21 = uVar17;
    }
    uVar16 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      uVar21 = uVar17;
    }
    uVar17 = uVar25 - uVar26;
    if (uVar25 < uVar26) {
      uVar17 = 0;
    }
    iVar15 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pZVar6 = ms->dictMatchState;
    pUVar7 = ms->hashTable;
    uVar14 = (ulong)ms->nextToUpdate;
    bVar13 = 0x40 - (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar25) {
      do {
        uVar20 = (ulong)(*(long *)(pBVar5 + uVar14) * -0x30e4432345000000) >> (bVar13 & 0x3f);
        pUVar4[(uint)uVar14 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar20];
        pUVar7[uVar20] = (uint)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar14 < ((long)ip - (long)pBVar5 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar25;
    lVar19 = *(long *)ip;
    uVar20 = lVar19 * -0x30e4432345000000;
    uVar11 = pUVar7[uVar20 >> (bVar13 & 0x3f)];
    uVar14 = 3;
    if (uVar21 <= uVar11) {
      uVar20 = uVar14;
      do {
        puVar18 = (ulong *)(pBVar5 + uVar11);
        if (*(BYTE *)(uVar20 + (long)puVar18) == ip[uVar20]) {
          puVar28 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar18 == *(ulong *)ip) {
              lVar19 = (ulong)uVar11 + 8;
              lVar24 = 0;
              do {
                puVar28 = (ulong *)(ip + lVar24 + 8);
                if (iLimit + -7 <= puVar28) {
                  puVar18 = (ulong *)(pBVar5 + lVar24 + lVar19);
                  goto LAB_00205bee;
                }
                lVar10 = lVar24 + lVar19;
                lVar24 = lVar24 + 8;
              } while (*(ulong *)(pBVar5 + lVar10) == *puVar28);
              uVar27 = *puVar28 ^ *(ulong *)(pBVar5 + lVar10);
              uVar14 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar24;
            }
            else {
              uVar27 = *(ulong *)ip ^ *puVar18;
              uVar14 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = uVar14 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00205bee:
            if ((puVar28 < iLimit + -3) && ((int)*puVar18 == (int)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar18 = (ulong *)((long)puVar18 + 4);
            }
            if ((puVar28 < iLimit + -1) && ((short)*puVar18 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar18 = (ulong *)((long)puVar18 + 2);
            }
            if (puVar28 < iLimit) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar18 == (char)*puVar28));
            }
            uVar14 = (long)puVar28 - (long)ip;
          }
          if ((uVar20 < uVar14) &&
             (*offsetPtr = (ulong)((uVar25 + 2) - uVar11), uVar20 = uVar14, ip + uVar14 == iLimit))
          goto LAB_00205f23;
        }
        uVar14 = uVar20;
        if ((uVar11 <= uVar17) ||
           ((iVar15 = iVar15 + -1, iVar15 == 0 ||
            (uVar11 = pUVar4[uVar11 & uVar26 - 1], uVar20 = uVar14, uVar11 < uVar21))))
        goto LAB_00205f23;
      } while( true );
    }
    goto LAB_00205f2e;
  }
  bVar1 = (byte)(ms->cParams).chainLog;
  uVar25 = 1 << (bVar1 & 0x1f);
  pUVar4 = ms->chainTable;
  pBVar5 = (ms->window).base;
  uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar17 = (ms->window).lowLimit;
  uVar26 = (uint)((long)ip - (long)pBVar5);
  uVar21 = uVar26 - uVar16;
  if (uVar26 - uVar17 <= uVar16) {
    uVar21 = uVar17;
  }
  uVar16 = (ms->window).dictLimit;
  if (ms->loadedDictEnd != 0) {
    uVar21 = uVar17;
  }
  uVar17 = uVar26 - uVar25;
  if (uVar26 < uVar25) {
    uVar17 = 0;
  }
  iVar15 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  pZVar6 = ms->dictMatchState;
  pUVar7 = ms->hashTable;
  uVar14 = (ulong)ms->nextToUpdate;
  bVar13 = 0x40 - (char)(ms->cParams).hashLog;
  if (ms->nextToUpdate < uVar26) {
    do {
      uVar20 = (ulong)(*(long *)(pBVar5 + uVar14) * -0x30e4432340650000) >> (bVar13 & 0x3f);
      pUVar4[(uint)uVar14 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar20];
      pUVar7[uVar20] = (uint)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar14 < ((long)ip - (long)pBVar5 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar26;
  local_80 = *(long *)ip;
  uVar20 = local_80 * -0x30e4432340650000;
  uVar11 = pUVar7[uVar20 >> (bVar13 & 0x3f)];
  uVar14 = 3;
  if (uVar21 <= uVar11) {
    uVar20 = uVar14;
    do {
      puVar18 = (ulong *)(pBVar5 + uVar11);
      if (*(BYTE *)(uVar20 + (long)puVar18) == ip[uVar20]) {
        puVar28 = (ulong *)ip;
        if (ip < iLimit + -7) {
          if (*puVar18 == *(ulong *)ip) {
            lVar19 = (ulong)uVar11 + 8;
            lVar24 = 0;
            do {
              puVar28 = (ulong *)(ip + lVar24 + 8);
              if (iLimit + -7 <= puVar28) {
                puVar18 = (ulong *)(pBVar5 + lVar24 + lVar19);
                goto LAB_0020585b;
              }
              lVar10 = lVar24 + lVar19;
              lVar24 = lVar24 + 8;
            } while (*(ulong *)(pBVar5 + lVar10) == *puVar28);
            uVar27 = *puVar28 ^ *(ulong *)(pBVar5 + lVar10);
            uVar14 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar24;
          }
          else {
            uVar27 = *(ulong *)ip ^ *puVar18;
            uVar14 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar14 = uVar14 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0020585b:
          if ((puVar28 < iLimit + -3) && ((int)*puVar18 == (int)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 4);
            puVar18 = (ulong *)((long)puVar18 + 4);
          }
          if ((puVar28 < iLimit + -1) && ((short)*puVar18 == (short)*puVar28)) {
            puVar28 = (ulong *)((long)puVar28 + 2);
            puVar18 = (ulong *)((long)puVar18 + 2);
          }
          if (puVar28 < iLimit) {
            puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar18 == (char)*puVar28));
          }
          uVar14 = (long)puVar28 - (long)ip;
        }
        if ((uVar20 < uVar14) &&
           (*offsetPtr = (ulong)((uVar26 + 2) - uVar11), uVar20 = uVar14, ip + uVar14 == iLimit))
        goto LAB_00205dd7;
      }
      uVar14 = uVar20;
      if ((uVar11 <= uVar17) ||
         ((iVar15 = iVar15 + -1, iVar15 == 0 ||
          (uVar11 = pUVar4[uVar11 & uVar25 - 1], uVar20 = uVar14, uVar11 < uVar21))))
      goto LAB_00205dd7;
    } while( true );
  }
  goto LAB_00205de8;
LAB_00205f23:
  lVar19 = *(long *)ip;
  uVar20 = lVar19 * -0x30e4432345000000;
LAB_00205f2e:
  uVar21 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
  pBVar8 = (pZVar6->window).nextSrc;
  pBVar9 = (pZVar6->window).base;
  uVar17 = (int)pBVar8 - (int)pBVar9;
  uVar26 = uVar17 - uVar21;
  if (uVar17 < uVar21) {
    uVar26 = 0;
  }
  if (iVar15 == 0) {
    return uVar14;
  }
  uVar11 = (pZVar6->window).dictLimit;
  uVar23 = pZVar6->hashTable[uVar20 >> (-(char)(pZVar6->cParams).hashLog & 0x3fU)];
  if (uVar23 < uVar11) {
    return uVar14;
  }
  pUVar4 = pZVar6->chainTable;
  while( true ) {
    iVar15 = iVar15 + -1;
    if (*(int *)(pBVar9 + uVar23) == (int)lVar19) {
      sVar12 = ZSTD_count_2segments(ip + 4,pBVar9 + (ulong)uVar23 + 4,iLimit,pBVar8,pBVar5 + uVar16)
      ;
      uVar20 = sVar12 + 4;
      if ((uVar14 < uVar20) &&
         (*offsetPtr = (ulong)(((uVar25 - uVar16) + uVar17 + 2) - uVar23), uVar14 = uVar20,
         ip + uVar20 == iLimit)) {
        return uVar20;
      }
    }
    if (uVar23 <= uVar26) {
      return uVar14;
    }
    if (iVar15 == 0) break;
    uVar23 = pUVar4[uVar23 & uVar21 - 1];
    if (uVar23 < uVar11) {
      return uVar14;
    }
  }
  return uVar14;
LAB_00205dd7:
  local_80 = *(long *)ip;
  uVar20 = local_80 * -0x30e4432340650000;
LAB_00205de8:
  uVar21 = 1 << ((byte)(pZVar6->cParams).chainLog & 0x1f);
  pBVar8 = (pZVar6->window).nextSrc;
  pBVar9 = (pZVar6->window).base;
  uVar17 = (int)pBVar8 - (int)pBVar9;
  uVar25 = uVar17 - uVar21;
  if (uVar17 < uVar21) {
    uVar25 = 0;
  }
  if (iVar15 != 0) {
    uVar11 = (pZVar6->window).dictLimit;
    uVar23 = pZVar6->hashTable[uVar20 >> (-(char)(pZVar6->cParams).hashLog & 0x3fU)];
    if (uVar11 <= uVar23) {
      pUVar4 = pZVar6->chainTable;
      while( true ) {
        iVar15 = iVar15 + -1;
        if (*(int *)(pBVar9 + uVar23) == (int)local_80) {
          sVar12 = ZSTD_count_2segments
                             (ip + 4,pBVar9 + (ulong)uVar23 + 4,iLimit,pBVar8,pBVar5 + uVar16);
          uVar20 = sVar12 + 4;
          if ((uVar14 < uVar20) &&
             (*offsetPtr = (ulong)(((uVar26 - uVar16) + uVar17 + 2) - uVar23), uVar14 = uVar20,
             ip + uVar20 == iLimit)) {
            return uVar20;
          }
        }
        if (uVar23 <= uVar25) {
          return uVar14;
        }
        if (iVar15 == 0) break;
        uVar23 = pUVar4[uVar23 & uVar21 - 1];
        if (uVar23 < uVar11) {
          return uVar14;
        }
      }
      return uVar14;
    }
  }
  return uVar14;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}